

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O3

void __thiscall
AssemblyCode::MoveRegMemCommand::MoveRegMemCommand
          (MoveRegMemCommand *this,CTemp *target,CTemp *source)

{
  pointer pcVar1;
  
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_00182d30;
  (this->target).name._M_dataplus._M_p = (pointer)&(this->target).name.field_2;
  pcVar1 = (target->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->target,pcVar1,pcVar1 + (target->name)._M_string_length);
  (this->source).name._M_dataplus._M_p = (pointer)&(this->source).name.field_2;
  pcVar1 = (source->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->source,pcVar1,pcVar1 + (source->name)._M_string_length);
  return;
}

Assistant:

AssemblyCode::MoveRegMemCommand::MoveRegMemCommand( const IRT::CTemp &target, const IRT::CTemp &source ) : target(
        target ), source( source ) { }